

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

bool __thiscall
cmake::SetCacheArgs(cmake *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args)

{
  pointer pcVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  CacheEntryType CVar6;
  int iVar7;
  pointer pbVar8;
  long lVar9;
  char *__s;
  long lVar10;
  mapped_type *pmVar11;
  ostream *poVar12;
  ulong uVar13;
  uint uVar14;
  mapped_type mVar15;
  size_type sVar16;
  undefined8 uVar17;
  string *key;
  string *key_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entriesToDelete;
  string entryPattern;
  CacheEntryType type;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cacheKeys;
  string path;
  bool local_191;
  ulong local_190;
  undefined1 local_178 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
  *local_138;
  CacheEntryType local_12c;
  undefined1 local_128 [17];
  undefined7 uStack_117;
  cmake *local_108;
  undefined1 local_100 [184];
  char *local_48;
  
  pbVar8 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  bVar3 = true;
  local_191 = 0x20 < (ulong)((long)(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8);
  if (local_191) {
    local_138 = &this->DiagLevels;
    bVar2 = 0;
    local_190 = 1;
    local_108 = this;
    do {
      pbVar8 = pbVar8 + local_190;
      lVar9 = std::__cxx11::string::find((char *)pbVar8,0x56ac50,0);
      iVar7 = (int)local_190;
      if (lVar9 == 0) {
        std::__cxx11::string::substr((ulong)local_100,(ulong)pbVar8);
        if ((char *)local_100._8_8_ == (char *)0x0) {
          local_190 = (ulong)(iVar7 + 1);
          if (local_190 <
              (ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5)) {
            std::__cxx11::string::_M_assign((string *)local_100);
            goto LAB_002b199b;
          }
          bVar3 = false;
          cmSystemTools::Error
                    ("-D must be followed with VAR=VALUE.",(char *)0x0,(char *)0x0,(char *)0x0);
        }
        else {
LAB_002b199b:
          local_158._M_allocated_capacity = (size_type)&local_148;
          local_158._8_8_ = 0;
          local_148._M_local_buf[0] = '\0';
          local_178._0_8_ = local_178 + 0x10;
          local_178._8_8_ = (string *)0x0;
          local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
          local_12c = UNINITIALIZED;
          bVar3 = cmState::ParseCacheEntry
                            ((string *)local_100,(string *)&local_158,(string *)local_178,&local_12c
                            );
          if (bVar3) {
            local_128._0_8_ = local_128 + 0x10;
            local_128._8_8_ = (string *)0x0;
            local_128[0x10] = 0;
            if (this->WarnUnusedCli == true) {
              __s = cmState::GetInitializedCacheValue(this->State,(string *)&local_158);
              uVar17 = local_128._8_8_;
              bVar4 = __s != (char *)0x0;
              if (bVar4) {
                strlen(__s);
                bVar4 = true;
                std::__cxx11::string::_M_replace((ulong)local_128,0,(char *)uVar17,(ulong)__s);
              }
            }
            else {
              bVar4 = false;
            }
            cmState::AddCacheEntry
                      (this->State,(string *)&local_158,(char *)local_178._0_8_,
                       "No help, variable specified on the command line.",local_12c);
            UnwatchUnusedCli(this,(string *)&local_158);
            if (this->WarnUnusedCli == true) {
              if (bVar4) {
                cmState::GetInitializedCacheValue(this->State,(string *)&local_158);
                iVar7 = std::__cxx11::string::compare(local_128);
                if (iVar7 == 0) goto LAB_002b1efe;
              }
              WatchUnusedCli(this,(string *)&local_158);
            }
LAB_002b1efe:
            if ((string *)local_128._0_8_ != (string *)(local_128 + 0x10)) {
              operator_delete((void *)local_128._0_8_,CONCAT71(uStack_117,local_128[0x10]) + 1);
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Parse error in command line argument: ",0x26);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,(pbVar8->_M_dataplus)._M_p,
                                 pbVar8->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,"Should be: VAR:type=value\n",0x1a);
            cmSystemTools::Error("No cmake script provided.",(char *)0x0,(char *)0x0,(char *)0x0);
          }
          if ((string *)local_178._0_8_ != (string *)(local_178 + 0x10)) {
            operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_allocated_capacity != &local_148) {
            operator_delete((void *)local_158._M_allocated_capacity,
                            CONCAT71(local_148._M_allocated_capacity._1_7_,local_148._M_local_buf[0]
                                    ) + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_100 + 0x10)) {
          operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
        }
        if (bVar3 == false) {
          bVar3 = false;
        }
        else {
LAB_002b21c8:
          bVar3 = true;
        }
      }
      else {
        iVar5 = strncmp((pbVar8->_M_dataplus)._M_p,"-W",2);
        if (iVar5 == 0) {
          std::__cxx11::string::substr((ulong)local_100,(ulong)pbVar8);
          if ((char *)local_100._8_8_ == (char *)0x0) {
            local_190 = (ulong)(iVar7 + 1);
            if ((ulong)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5) <= local_190) {
              bVar3 = false;
              cmSystemTools::Error
                        ("-W must be followed with [no-]<name>.",(char *)0x0,(char *)0x0,(char *)0x0
                        );
              goto LAB_002b20d4;
            }
            std::__cxx11::string::_M_assign((string *)local_100);
          }
          local_158._M_allocated_capacity = (size_type)&local_148;
          local_158._8_8_ = 0;
          local_148._M_local_buf[0] = '\0';
          lVar9 = std::__cxx11::string::find(local_100,0x56ad2d,0);
          lVar10 = std::__cxx11::string::find(local_100,0x56ad31,(ulong)((uint)(lVar9 == 0) * 3));
          std::__cxx11::string::substr((ulong)local_178,(ulong)local_100);
          std::__cxx11::string::operator=((string *)local_158._M_local_buf,(string *)local_178);
          if ((string *)local_178._0_8_ != (string *)(local_178 + 0x10)) {
            operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
          }
          this = local_108;
          bVar3 = local_158._8_8_ != 0;
          if (local_158._8_8_ == 0) {
            cmSystemTools::Error("No warning name provided.",(char *)0x0,(char *)0x0,(char *)0x0);
          }
          else if (lVar9 == 0 || lVar10 == 0) {
            if (lVar9 == 0 && lVar10 != 0) {
              pmVar11 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                        ::operator[](local_138,(key_type *)&local_158);
              *pmVar11 = DIAG_IGNORE;
            }
            else {
              if ((lVar9 == 0) || (lVar10 != 0)) {
                pmVar11 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                          ::operator[](local_138,(key_type *)&local_158);
                mVar15 = *pmVar11;
                pmVar11 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                          ::operator[](local_138,(key_type *)&local_158);
                if (0 < (int)mVar15) {
                  mVar15 = DIAG_WARN;
                }
                goto LAB_002b1ff8;
              }
              pmVar11 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                        ::operator[](local_138,(key_type *)&local_158);
              *pmVar11 = DIAG_ERROR;
            }
          }
          else {
            pmVar11 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                      ::operator[](local_138,(key_type *)&local_158);
            mVar15 = *pmVar11;
            pmVar11 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                      ::operator[](local_138,(key_type *)&local_158);
            if ((int)mVar15 < 2) {
              mVar15 = DIAG_WARN;
            }
LAB_002b1ff8:
            *pmVar11 = mVar15;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_allocated_capacity != &local_148) {
            operator_delete((void *)local_158._M_allocated_capacity,
                            CONCAT71(local_148._M_allocated_capacity._1_7_,local_148._M_local_buf[0]
                                    ) + 1);
          }
LAB_002b20d4:
          sVar16 = local_100._16_8_;
          uVar17 = local_100._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_100 + 0x10)) {
LAB_002b20f1:
            operator_delete((void *)uVar17,sVar16 + 1);
          }
LAB_002b20f9:
          uVar14 = (uint)local_190;
          if (bVar3) goto LAB_002b21c8;
        }
        else {
          lVar9 = std::__cxx11::string::find((char *)pbVar8,0x56ad52,0);
          if (lVar9 == 0) {
            std::__cxx11::string::substr((ulong)&local_158,(ulong)pbVar8);
            if (local_158._8_8_ == 0) {
              local_190 = (ulong)(iVar7 + 1);
              if (local_190 <
                  (ulong)((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start >> 5)) {
                std::__cxx11::string::_M_assign((string *)local_158._M_local_buf);
                goto LAB_002b1ca5;
              }
              bVar3 = false;
              cmSystemTools::Error
                        ("-U must be followed with VAR.",(char *)0x0,(char *)0x0,(char *)0x0);
            }
            else {
LAB_002b1ca5:
              cmsys::Glob::PatternToRegex((string *)local_178,(string *)&local_158,true,true);
              local_48 = (char *)0x0;
              if ((string *)local_178._0_8_ != (string *)0x0) {
                cmsys::RegularExpression::compile
                          ((RegularExpression *)local_100,(char *)local_178._0_8_);
              }
              if ((string *)local_178._0_8_ != (string *)(local_178 + 0x10)) {
                operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
              }
              local_178._0_8_ = (string *)0x0;
              local_178._8_8_ = (string *)0x0;
              local_178._16_8_ = 0;
              cmState::GetCacheEntryKeys_abi_cxx11_
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_128,this->State);
              for (key = (string *)local_128._0_8_; key_00 = (string *)local_178._0_8_,
                  key != (string *)local_128._8_8_; key = key + 1) {
                CVar6 = cmState::GetCacheEntryType(this->State,key);
                if ((CVar6 != STATIC) &&
                   (bVar3 = cmsys::RegularExpression::find
                                      ((RegularExpression *)local_100,(key->_M_dataplus)._M_p),
                   bVar3)) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_178,key);
                }
              }
              for (; key_00 != (string *)local_178._8_8_; key_00 = key_00 + 1) {
                cmState::RemoveCacheEntry(this->State,key_00);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_128);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_178);
              if (local_48 != (char *)0x0) {
                operator_delete__(local_48);
              }
              bVar3 = true;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_allocated_capacity != &local_148) {
              sVar16 = CONCAT71(local_148._M_allocated_capacity._1_7_,local_148._M_local_buf[0]);
              uVar17 = local_158._M_allocated_capacity;
              goto LAB_002b20f1;
            }
            goto LAB_002b20f9;
          }
          lVar9 = std::__cxx11::string::find((char *)pbVar8,0x56ad73,0);
          if (lVar9 == 0) {
            std::__cxx11::string::substr((ulong)local_100,(ulong)pbVar8);
            if ((char *)local_100._8_8_ == (char *)0x0) {
              local_190 = (ulong)(iVar7 + 1);
              if ((ulong)((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start >> 5) <= local_190) {
                bVar3 = false;
                cmSystemTools::Error
                          ("-C must be followed by a file name.",(char *)0x0,(char *)0x0,(char *)0x0
                          );
                goto LAB_002b20d4;
              }
              std::__cxx11::string::_M_assign((string *)local_100);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"loading initial cache file ",0x1b);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,(char *)local_100._0_8_,local_100._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
            bVar3 = true;
            ReadListFile(this,args,(char *)local_100._0_8_);
            goto LAB_002b20d4;
          }
          lVar9 = std::__cxx11::string::find((char *)pbVar8,0x56adb6,0);
          if (lVar9 != 0) {
            lVar9 = std::__cxx11::string::find((char *)pbVar8,0x56addd,0);
            if (lVar9 == 0) {
              bVar2 = 1;
            }
            goto LAB_002b21c8;
          }
          uVar14 = iVar7 + 1;
          local_190 = (ulong)uVar14;
          pbVar8 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <=
              local_190) {
            bVar3 = false;
            cmSystemTools::Error
                      ("-P must be followed by a file name.",(char *)0x0,(char *)0x0,(char *)0x0);
            local_190._0_4_ = uVar14;
            goto LAB_002b21cb;
          }
          local_100._0_8_ = local_100 + 0x10;
          pcVar1 = pbVar8[local_190]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_100,pcVar1,pcVar1 + pbVar8[local_190]._M_string_length);
          uVar17 = local_100._8_8_;
          if ((char *)local_100._8_8_ == (char *)0x0) {
            cmSystemTools::Error("No cmake script provided.",(char *)0x0,(char *)0x0,(char *)0x0);
          }
          else {
            GetProjectCommandsInScriptMode(this->State);
            ReadListFile(this,args,(char *)local_100._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_100 + 0x10)) {
            operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
          }
          if ((char *)uVar17 != (char *)0x0) goto LAB_002b21c8;
        }
        local_190._0_4_ = uVar14;
        bVar3 = false;
      }
LAB_002b21cb:
      if (!bVar3) break;
      local_190 = (ulong)((uint)local_190 + 1);
      pbVar8 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar13 = (long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5;
      local_191 = local_190 < uVar13;
    } while (local_190 < uVar13);
    bVar3 = (bool)(bVar2 ^ 1);
  }
  bVar4 = (bool)(local_191 ^ 1);
  if ((local_191 == false) && (!bVar3)) {
    bVar4 = FindPackage(this,args);
  }
  return bVar4;
}

Assistant:

bool cmake::SetCacheArgs(const std::vector<std::string>& args)
{
  bool findPackageMode = false;
  for (unsigned int i = 1; i < args.size(); ++i) {
    std::string const& arg = args[i];
    if (arg.find("-D", 0) == 0) {
      std::string entry = arg.substr(2);
      if (entry.empty()) {
        ++i;
        if (i < args.size()) {
          entry = args[i];
        } else {
          cmSystemTools::Error("-D must be followed with VAR=VALUE.");
          return false;
        }
      }
      std::string var, value;
      cmStateEnums::CacheEntryType type = cmStateEnums::UNINITIALIZED;
      if (cmState::ParseCacheEntry(entry, var, value, type)) {
        // The value is transformed if it is a filepath for example, so
        // we can't compare whether the value is already in the cache until
        // after we call AddCacheEntry.
        bool haveValue = false;
        std::string cachedValue;
        if (this->WarnUnusedCli) {
          if (const char* v = this->State->GetInitializedCacheValue(var)) {
            haveValue = true;
            cachedValue = v;
          }
        }

        this->AddCacheEntry(var, value.c_str(),
                            "No help, variable specified on the command line.",
                            type);

        if (this->WarnUnusedCli) {
          if (!haveValue ||
              cachedValue != this->State->GetInitializedCacheValue(var)) {
            this->WatchUnusedCli(var);
          }
        }
      } else {
        std::cerr << "Parse error in command line argument: " << arg << "\n"
                  << "Should be: VAR:type=value\n";
        cmSystemTools::Error("No cmake script provided.");
        return false;
      }
    } else if (cmHasLiteralPrefix(arg, "-W")) {
      std::string entry = arg.substr(2);
      if (entry.empty()) {
        ++i;
        if (i < args.size()) {
          entry = args[i];
        } else {
          cmSystemTools::Error("-W must be followed with [no-]<name>.");
          return false;
        }
      }

      std::string name;
      bool foundNo = false;
      bool foundError = false;
      unsigned int nameStartPosition = 0;

      if (entry.find("no-", nameStartPosition) == 0) {
        foundNo = true;
        nameStartPosition += 3;
      }

      if (entry.find("error=", nameStartPosition) == 0) {
        foundError = true;
        nameStartPosition += 6;
      }

      name = entry.substr(nameStartPosition);
      if (name.empty()) {
        cmSystemTools::Error("No warning name provided.");
        return false;
      }

      if (!foundNo && !foundError) {
        // -W<name>
        this->DiagLevels[name] = std::max(this->DiagLevels[name], DIAG_WARN);
      } else if (foundNo && !foundError) {
        // -Wno<name>
        this->DiagLevels[name] = DIAG_IGNORE;
      } else if (!foundNo && foundError) {
        // -Werror=<name>
        this->DiagLevels[name] = DIAG_ERROR;
      } else {
        // -Wno-error=<name>
        this->DiagLevels[name] = std::min(this->DiagLevels[name], DIAG_WARN);
      }
    } else if (arg.find("-U", 0) == 0) {
      std::string entryPattern = arg.substr(2);
      if (entryPattern.empty()) {
        ++i;
        if (i < args.size()) {
          entryPattern = args[i];
        } else {
          cmSystemTools::Error("-U must be followed with VAR.");
          return false;
        }
      }
      cmsys::RegularExpression regex(
        cmsys::Glob::PatternToRegex(entryPattern, true, true).c_str());
      // go through all cache entries and collect the vars which will be
      // removed
      std::vector<std::string> entriesToDelete;
      std::vector<std::string> cacheKeys = this->State->GetCacheEntryKeys();
      for (std::vector<std::string>::const_iterator it = cacheKeys.begin();
           it != cacheKeys.end(); ++it) {
        cmStateEnums::CacheEntryType t = this->State->GetCacheEntryType(*it);
        if (t != cmStateEnums::STATIC) {
          if (regex.find(it->c_str())) {
            entriesToDelete.push_back(*it);
          }
        }
      }

      // now remove them from the cache
      for (std::vector<std::string>::const_iterator currentEntry =
             entriesToDelete.begin();
           currentEntry != entriesToDelete.end(); ++currentEntry) {
        this->State->RemoveCacheEntry(*currentEntry);
      }
    } else if (arg.find("-C", 0) == 0) {
      std::string path = arg.substr(2);
      if (path.empty()) {
        ++i;
        if (i < args.size()) {
          path = args[i];
        } else {
          cmSystemTools::Error("-C must be followed by a file name.");
          return false;
        }
      }
      std::cout << "loading initial cache file " << path << "\n";
      this->ReadListFile(args, path.c_str());
    } else if (arg.find("-P", 0) == 0) {
      i++;
      if (i >= args.size()) {
        cmSystemTools::Error("-P must be followed by a file name.");
        return false;
      }
      std::string path = args[i];
      if (path.empty()) {
        cmSystemTools::Error("No cmake script provided.");
        return false;
      }
      // Register fake project commands that hint misuse in script mode.
      GetProjectCommandsInScriptMode(this->State);
      this->ReadListFile(args, path.c_str());
    } else if (arg.find("--find-package", 0) == 0) {
      findPackageMode = true;
    }
  }

  if (findPackageMode) {
    return this->FindPackage(args);
  }

  return true;
}